

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashListEntry_GetKey(ktxHashListEntry *This,uint *pKeyLen,char **ppKey)

{
  ktxKVListEntry *kv;
  char **ppKey_local;
  uint *pKeyLen_local;
  ktxHashListEntry *This_local;
  ktx_error_code_e local_4;
  
  if ((pKeyLen == (uint *)0x0) || (ppKey == (char **)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    *pKeyLen = This->keyLen;
    *ppKey = This->key;
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashListEntry_GetKey(ktxHashListEntry* This,
                        unsigned int* pKeyLen, char** ppKey)
{
    if (pKeyLen && ppKey) {
        ktxKVListEntry* kv = (ktxKVListEntry*)This;
        *pKeyLen = kv->keyLen;
        *ppKey = kv->key;
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}